

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

PNode * commit_tree(Parser *p,PNode *pn)

{
  int iVar1;
  int iVar2;
  PNode *pPVar3;
  uint32 uVar4;
  PNode *pPVar5;
  bool bVar6;
  PNode **local_58;
  void **v0;
  PNode *tpn;
  PNode *_t;
  uint internal;
  uint fixup;
  uint fixup_ebnf;
  uint i;
  PNode *pn_local;
  Parser *p_local;
  
  while (pn->latest != pn->latest->latest) {
    pPVar5 = pn->latest->latest;
    pPVar5->refcount = pPVar5->refcount + 1;
    uVar4 = pn->latest->refcount - 1;
    pn->latest->refcount = uVar4;
    if (uVar4 == 0) {
      free_PNode(p,pn->latest);
    }
    pn->latest = pPVar5;
  }
  _fixup_ebnf = (Parser *)pn->latest;
  p_local = _fixup_ebnf;
  if (*(uint8 *)((long)&(_fixup_ebnf->user).syntax_error_fn + 4) == '\0') {
    if (((((d_loc_t *)&_fixup_ebnf->t)->s != *(char **)&_fixup_ebnf->ambiguities) ||
        ((D_Reduction *)(_fixup_ebnf->user).ambiguity_fn == (D_Reduction *)0x0)) ||
       (((D_Reduction *)(_fixup_ebnf->user).ambiguity_fn)->final_code == (D_ReductionCode)0x0)) {
      *(uint8 *)((long)&(_fixup_ebnf->user).syntax_error_fn + 4) = '\x01';
    }
    if (*(PNode **)&(_fixup_ebnf->user).dont_merge_epsilon_trees != (PNode *)0x0) {
      _fixup_ebnf = (Parser *)resolve_ambiguities(p,(PNode *)_fixup_ebnf);
    }
    if (_fixup_ebnf == (Parser *)0x0) {
      p_local = (Parser *)0x0;
    }
    else {
      iVar1 = (p->user).fixup_EBNF_productions;
      bVar6 = true;
      if (p->t->symbols[((D_ParseNode *)&_fixup_ebnf->end)->symbol].kind != 2) {
        bVar6 = p->t->symbols[((D_ParseNode *)&_fixup_ebnf->end)->symbol].kind == 3;
      }
      iVar2 = (p->user).dont_fixup_internal_productions;
      for (fixup = 0; fixup < ((VecPNode *)&(_fixup_ebnf->user).loc)->n; fixup = fixup + 1) {
        pPVar5 = commit_tree(p,((VecPNode *)&(_fixup_ebnf->user).loc)->v[fixup]);
        if (pPVar5 == (PNode *)0x0) {
          return (PNode *)0x0;
        }
        if (pPVar5 != ((VecPNode *)&(_fixup_ebnf->user).loc)->v[fixup]) {
          pPVar5->refcount = pPVar5->refcount + 1;
          pPVar3 = ((VecPNode *)&(_fixup_ebnf->user).loc)->v[fixup];
          uVar4 = pPVar3->refcount - 1;
          pPVar3->refcount = uVar4;
          if (uVar4 == 0) {
            free_PNode(p,((VecPNode *)&(_fixup_ebnf->user).loc)->v[fixup]);
          }
          ((VecPNode *)&(_fixup_ebnf->user).loc)->v[fixup] = pPVar5;
        }
        if (iVar2 == 0 && bVar6) {
          if (iVar1 == 0) {
            if (p->t->symbols[(((VecPNode *)&(_fixup_ebnf->user).loc)->v[fixup]->parse_node).symbol]
                .kind == 2) goto LAB_0015340a;
          }
          else if ((p->t->symbols
                    [(((VecPNode *)&(_fixup_ebnf->user).loc)->v[fixup]->parse_node).symbol].kind ==
                    2) || (p->t->symbols
                           [(((VecPNode *)&(_fixup_ebnf->user).loc)->v[fixup]->parse_node).symbol].
                           kind == 3)) {
LAB_0015340a:
            fixup_internal_symbol(p,(PNode *)_fixup_ebnf,fixup);
            fixup = fixup - 1;
          }
        }
      }
      if (((D_Reduction *)(_fixup_ebnf->user).ambiguity_fn != (D_Reduction *)0x0) &&
         (((D_Reduction *)(_fixup_ebnf->user).ambiguity_fn)->final_code != (D_ReductionCode)0x0)) {
        if (((VecPNode *)&(_fixup_ebnf->user).loc)->v == (PNode **)0x0) {
          local_58 = (PNode **)0x0;
        }
        else {
          local_58 = ((VecPNode *)&(_fixup_ebnf->user).loc)->v;
        }
        (*((D_Reduction *)(_fixup_ebnf->user).ambiguity_fn)->final_code)
                  (_fixup_ebnf,local_58,((VecPNode *)&(_fixup_ebnf->user).loc)->n,0x90,&p->user);
      }
      if (((*(uint8 *)((long)&(_fixup_ebnf->user).syntax_error_fn + 4) != '\0') &&
          ((p->user).save_parse_tree == 0)) && (!bVar6)) {
        free_ParseTreeBelow(p,(PNode *)_fixup_ebnf);
      }
      p_local = _fixup_ebnf;
    }
  }
  return (PNode *)p_local;
}

Assistant:

static PNode *commit_tree(Parser *p, PNode *pn) {
  uint i, fixup_ebnf = 0, fixup = 0, internal = 0;
  LATEST(p, pn);
  if (pn->evaluated) return pn;
  if (!is_unreduced_epsilon_PNode(pn)) pn->evaluated = 1;
  if (pn->ambiguities) pn = resolve_ambiguities(p, pn);
  if (!pn) return NULL;
  fixup_ebnf = p->user.fixup_EBNF_productions;
  internal = is_symbol_internal_or_EBNF(p, pn);
  fixup = !p->user.dont_fixup_internal_productions && internal;
  for (i = 0; i < pn->children.n; i++) {
    PNode *tpn = commit_tree(p, pn->children.v[i]);
    if (!tpn) return NULL;
    if (tpn != pn->children.v[i]) {
      ref_pn(tpn);
      unref_pn(p, pn->children.v[i]);
      pn->children.v[i] = tpn;
    }
    if (fixup &&
        (fixup_ebnf ? is_symbol_internal_or_EBNF(p, pn->children.v[i]) : is_symbol_internal(p, pn->children.v[i]))) {
      fixup_internal_symbol(p, pn, i);
      i -= 1;
      continue;
    }
  }
  if (pn->reduction) DBG(printf("commit %p (%s)\n", (void *)pn, p->t->symbols[pn->parse_node.symbol].name));
  if (pn->reduction && pn->reduction->final_code) {
    void **v0 = pn->children.v == NULL ?  NULL : (void **)&pn->children.v[0];
    pn->reduction->final_code(pn, v0, pn->children.n, (intptr_t)(sizeof(PNode) - sizeof(D_ParseNode)),
                              (D_Parser *)p);
  }
  if (pn->evaluated) {
    if (!p->user.save_parse_tree && !internal) free_ParseTreeBelow(p, pn);
  }
  return pn;
}